

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::SliderBehaviorT<double,double,double>
               (ImRect *bb,ImGuiID id,ImGuiDataType data_type,double *v,double v_min,double v_max,
               char *format,float power,ImGuiSliderFlags flags,ImRect *out_grab_bb)

{
  float fVar1;
  bool bVar2;
  ImGuiContext *pIVar3;
  int iVar4;
  ImGuiContext *g;
  uint uVar5;
  ulong uVar6;
  bool bVar7;
  uint uVar8;
  ulong uVar9;
  float fVar10;
  double dVar11;
  double dVar12;
  ImVec2 IVar13;
  double dVar14;
  double dVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  
  pIVar3 = GImGui;
  uVar6 = (ulong)(flags & 1);
  uVar5 = data_type & 0xfffffffe;
  bVar7 = uVar5 == 8;
  bVar2 = power != 1.0;
  fVar18 = (&(bb->Min).x)[uVar6];
  fVar1 = (&(bb->Max).x)[uVar6];
  fVar17 = (fVar1 - fVar18) + -4.0;
  fVar16 = (GImGui->Style).GrabMinSize;
  dVar15 = v_max - v_min;
  dVar14 = (double)(~-(ulong)(v_min < v_max) & (ulong)(v_min - v_max) |
                   -(ulong)(v_min < v_max) & (ulong)dVar15);
  if ((uVar5 != 8) && (0.0 <= dVar14)) {
    fVar10 = (float)((double)fVar17 / (dVar14 + 1.0));
    uVar8 = -(uint)(fVar16 <= fVar10);
    fVar16 = (float)(~uVar8 & (uint)fVar16 | (uint)fVar10 & uVar8);
  }
  if (fVar17 <= fVar16) {
    fVar16 = fVar17;
  }
  if ((!bVar2 || !bVar7) || 0.0 <= v_min * v_max) {
    if (v_min < 0.0) {
      fVar10 = 1.0;
    }
    else {
      fVar10 = 0.0;
    }
  }
  else {
    uVar9 = -(ulong)(-v_min <= v_min);
    dVar11 = pow((double)(uVar9 & (ulong)v_min | ~uVar9 & (ulong)-v_min),1.0 / (double)power);
    uVar9 = -(ulong)(-v_max <= v_max);
    dVar12 = pow((double)(uVar9 & (ulong)v_max | ~uVar9 & (ulong)-v_max),1.0 / (double)power);
    fVar10 = (float)(dVar11 / (dVar12 + dVar11));
  }
  fVar18 = fVar18 + 2.0 + fVar16 * 0.5;
  if (pIVar3->ActiveId != id) {
    bVar2 = false;
    goto LAB_0019b9dd;
  }
  if (pIVar3->ActiveIdSource == ImGuiInputSource_Nav) {
    IVar13 = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.0,0.0);
    fVar19 = IVar13.x;
    if (uVar6 != 0) {
      fVar19 = -IVar13.y;
    }
    if ((pIVar3->NavActivatePressedId == id) && (pIVar3->ActiveIdIsJustActivated == false)) {
      ClearActiveID();
    }
    else if ((fVar19 != 0.0) || (NAN(fVar19))) {
      fVar20 = SliderCalcRatioFromValueT<double,double>(data_type,*v,v_min,v_max,power,fVar10);
      if ((uVar5 != 8) ||
         (iVar4 = ImParseFormatPrecision(format,3), (bool)(~(bVar2 && bVar7) & iVar4 < 1))) {
        if ((ABS(dVar14) <= 100.0) || (0.0 < (GImGui->IO).NavInputs[0xe])) {
          fVar19 = *(float *)(&DAT_0021dda0 + (ulong)(fVar19 < 0.0) * 4) / (float)dVar14;
        }
        else {
          fVar19 = fVar19 / 100.0;
        }
      }
      else {
        fVar19 = fVar19 / 100.0;
        if (0.0 < (GImGui->IO).NavInputs[0xe]) {
          fVar19 = fVar19 / 10.0;
        }
      }
      uVar8 = -(uint)(0.0 < (GImGui->IO).NavInputs[0xf]);
      fVar19 = (float)(~uVar8 & (uint)fVar19 | (uint)(fVar19 * 10.0) & uVar8);
      if ((1.0 <= fVar20) && (0.0 < fVar19)) {
        bVar2 = false;
        goto LAB_0019b9dd;
      }
      if ((0.0 < fVar20) || (0.0 <= fVar19)) {
        fVar20 = fVar20 + fVar19;
        fVar19 = 1.0;
        if (fVar20 <= 1.0) {
          fVar19 = fVar20;
        }
        fVar19 = (float)(~-(uint)(fVar20 < 0.0) & (uint)fVar19);
        goto LAB_0019b84b;
      }
      goto LAB_0019b6ed;
    }
    bVar2 = false;
  }
  else {
    if (pIVar3->ActiveIdSource == ImGuiInputSource_Mouse) {
      if ((pIVar3->IO).MouseDown[0] != false) {
        fVar19 = 0.0;
        if (0.0 < fVar17 - fVar16) {
          fVar20 = (*(float *)((pIVar3->IO).MouseDown + uVar6 * 4 + -8) - fVar18) /
                   (fVar17 - fVar16);
          fVar19 = 1.0;
          if (fVar20 <= 1.0) {
            fVar19 = fVar20;
          }
          fVar19 = (float)(~-(uint)(fVar20 < 0.0) & (uint)fVar19);
        }
        if (uVar6 != 0) {
          fVar19 = 1.0 - fVar19;
        }
LAB_0019b84b:
        if (bVar2 && bVar7) {
          if (fVar10 <= fVar19) {
            uVar5 = -(uint)(1e-06 < ABS(fVar10 + -1.0));
            fVar19 = powf((float)(~uVar5 & (uint)fVar19 |
                                 (uint)((fVar19 - fVar10) / (1.0 - fVar10)) & uVar5),power);
            dVar14 = (double)(-(ulong)(0.0 <= v_min) & (ulong)v_min);
            dVar14 = (double)fVar19 * (v_max - dVar14) + dVar14;
          }
          else {
            fVar19 = powf(1.0 - fVar19 / fVar10,power);
            dVar14 = v_max;
            if (0.0 <= v_max) {
              dVar14 = 0.0;
            }
            dVar14 = (double)fVar19 * (v_min - dVar14) + dVar14;
          }
        }
        else {
          if (uVar5 == 8) {
            dVar14 = dVar15 * (double)fVar19;
          }
          else {
            dVar15 = dVar15 * (double)fVar19;
            dVar14 = dVar15 + 0.5;
            if (dVar15 + 0.5 <= dVar15) {
              dVar14 = dVar15;
            }
          }
          dVar14 = dVar14 + v_min;
        }
        dVar15 = RoundScalarWithFormatT<double,double>(format,data_type,dVar14);
        if ((*v != dVar15) || (NAN(*v) || NAN(dVar15))) {
          *v = dVar15;
          bVar2 = true;
        }
        else {
          bVar2 = false;
        }
        goto LAB_0019b9dd;
      }
      ClearActiveID();
    }
LAB_0019b6ed:
    bVar2 = false;
  }
LAB_0019b9dd:
  if (1.0 <= fVar17) {
    fVar17 = SliderCalcRatioFromValueT<double,double>(data_type,*v,v_min,v_max,power,fVar10);
    if (uVar6 != 0) {
      fVar17 = 1.0 - fVar17;
    }
    fVar18 = (((fVar1 + -2.0) - fVar16 * 0.5) - fVar18) * fVar17 + fVar18;
    if (uVar6 == 0) {
      fVar1 = (bb->Min).y;
      fVar17 = (bb->Max).y;
      (out_grab_bb->Min).x = -fVar16 * 0.5 + fVar18;
      (out_grab_bb->Min).y = fVar1 + 2.0;
      (out_grab_bb->Max).x = fVar16 * 0.5 + fVar18;
      (out_grab_bb->Max).y = fVar17 + -2.0;
    }
    else {
      fVar1 = (bb->Max).x;
      (out_grab_bb->Min).x = (bb->Min).x + 2.0;
      (out_grab_bb->Min).y = -fVar16 * 0.5 + fVar18;
      (out_grab_bb->Max).x = fVar1 + -2.0;
      (out_grab_bb->Max).y = fVar16 * 0.5 + fVar18;
    }
  }
  else {
    IVar13 = bb->Min;
    out_grab_bb->Min = IVar13;
    out_grab_bb->Max = IVar13;
  }
  return bVar2;
}

Assistant:

bool ImGui::SliderBehaviorT(const ImRect& bb, ImGuiID id, ImGuiDataType data_type, TYPE* v, const TYPE v_min, const TYPE v_max, const char* format, float power, ImGuiSliderFlags flags, ImRect* out_grab_bb)
{
    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_decimal = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
    const bool is_power = (power != 1.0f) && is_decimal;

    const float grab_padding = 2.0f;
    const float slider_sz = (bb.Max[axis] - bb.Min[axis]) - grab_padding * 2.0f;
    float grab_sz = style.GrabMinSize;
    SIGNEDTYPE v_range = (v_min < v_max ? v_max - v_min : v_min - v_max);
    if (!is_decimal && v_range >= 0)                                             // v_range < 0 may happen on integer overflows
        grab_sz = ImMax((float)(slider_sz / (v_range + 1)), style.GrabMinSize);  // For integer sliders: if possible have the grab size represent 1 unit
    grab_sz = ImMin(grab_sz, slider_sz);
    const float slider_usable_sz = slider_sz - grab_sz;
    const float slider_usable_pos_min = bb.Min[axis] + grab_padding + grab_sz * 0.5f;
    const float slider_usable_pos_max = bb.Max[axis] - grab_padding - grab_sz * 0.5f;

    // For power curve sliders that cross over sign boundary we want the curve to be symmetric around 0.0f
    float linear_zero_pos;   // 0.0->1.0f
    if (is_power && v_min * v_max < 0.0f)
    {
        // Different sign
        const FLOATTYPE linear_dist_min_to_0 = ImPow(v_min >= 0 ? (FLOATTYPE)v_min : -(FLOATTYPE)v_min, (FLOATTYPE)1.0f / power);
        const FLOATTYPE linear_dist_max_to_0 = ImPow(v_max >= 0 ? (FLOATTYPE)v_max : -(FLOATTYPE)v_max, (FLOATTYPE)1.0f / power);
        linear_zero_pos = (float)(linear_dist_min_to_0 / (linear_dist_min_to_0 + linear_dist_max_to_0));
    }
    else
    {
        // Same sign
        linear_zero_pos = v_min < 0.0f ? 1.0f : 0.0f;
    }

    // Process interacting with the slider
    bool value_changed = false;
    if (g.ActiveId == id)
    {
        bool set_new_value = false;
        float clicked_t = 0.0f;
        if (g.ActiveIdSource == ImGuiInputSource_Mouse)
        {
            if (!g.IO.MouseDown[0])
            {
                ClearActiveID();
            }
            else
            {
                const float mouse_abs_pos = g.IO.MousePos[axis];
                clicked_t = (slider_usable_sz > 0.0f) ? ImClamp((mouse_abs_pos - slider_usable_pos_min) / slider_usable_sz, 0.0f, 1.0f) : 0.0f;
                if (axis == ImGuiAxis_Y)
                    clicked_t = 1.0f - clicked_t;
                set_new_value = true;
            }
        }
        else if (g.ActiveIdSource == ImGuiInputSource_Nav)
        {
            const ImVec2 delta2 = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 0.0f, 0.0f);
            float delta = (axis == ImGuiAxis_X) ? delta2.x : -delta2.y;
            if (g.NavActivatePressedId == id && !g.ActiveIdIsJustActivated)
            {
                ClearActiveID();
            }
            else if (delta != 0.0f)
            {
                clicked_t = SliderCalcRatioFromValueT<TYPE,FLOATTYPE>(data_type, *v, v_min, v_max, power, linear_zero_pos);
                const int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 0;
                if ((decimal_precision > 0) || is_power)
                {
                    delta /= 100.0f;    // Gamepad/keyboard tweak speeds in % of slider bounds
                    if (IsNavInputDown(ImGuiNavInput_TweakSlow))
                        delta /= 10.0f;
                }
                else
                {
                    if ((v_range >= -100.0f && v_range <= 100.0f) || IsNavInputDown(ImGuiNavInput_TweakSlow))
                        delta = ((delta < 0.0f) ? -1.0f : +1.0f) / (float)v_range; // Gamepad/keyboard tweak speeds in integer steps
                    else
                        delta /= 100.0f;
                }
                if (IsNavInputDown(ImGuiNavInput_TweakFast))
                    delta *= 10.0f;
                set_new_value = true;
                if ((clicked_t >= 1.0f && delta > 0.0f) || (clicked_t <= 0.0f && delta < 0.0f)) // This is to avoid applying the saturation when already past the limits
                    set_new_value = false;
                else
                    clicked_t = ImSaturate(clicked_t + delta);
            }
        }

        if (set_new_value)
        {
            TYPE v_new;
            if (is_power)
            {
                // Account for power curve scale on both sides of the zero
                if (clicked_t < linear_zero_pos)
                {
                    // Negative: rescale to the negative range before powering
                    float a = 1.0f - (clicked_t / linear_zero_pos);
                    a = ImPow(a, power);
                    v_new = ImLerp(ImMin(v_max, (TYPE)0), v_min, a);
                }
                else
                {
                    // Positive: rescale to the positive range before powering
                    float a;
                    if (ImFabs(linear_zero_pos - 1.0f) > 1.e-6f)
                        a = (clicked_t - linear_zero_pos) / (1.0f - linear_zero_pos);
                    else
                        a = clicked_t;
                    a = ImPow(a, power);
                    v_new = ImLerp(ImMax(v_min, (TYPE)0), v_max, a);
                }
            }
            else
            {
                // Linear slider
                if (is_decimal)
                {
                    v_new = ImLerp(v_min, v_max, clicked_t);
                }
                else
                {
                    // For integer values we want the clicking position to match the grab box so we round above
                    // This code is carefully tuned to work with large values (e.g. high ranges of U64) while preserving this property..
                    FLOATTYPE v_new_off_f = (v_max - v_min) * clicked_t;
                    TYPE v_new_off_floor = (TYPE)(v_new_off_f);
                    TYPE v_new_off_round = (TYPE)(v_new_off_f + (FLOATTYPE)0.5);
                    if (v_new_off_floor < v_new_off_round)
                        v_new = v_min + v_new_off_round;
                    else
                        v_new = v_min + v_new_off_floor;
                }
            }

            // Round to user desired precision based on format string
            v_new = RoundScalarWithFormatT<TYPE,SIGNEDTYPE>(format, data_type, v_new);

            // Apply result
            if (*v != v_new)
            {
                *v = v_new;
                value_changed = true;
            }
        }
    }

    if (slider_sz < 1.0f)
    {
        *out_grab_bb = ImRect(bb.Min, bb.Min);
    }
    else
    {
        // Output grab position so it can be displayed by the caller
        float grab_t = SliderCalcRatioFromValueT<TYPE, FLOATTYPE>(data_type, *v, v_min, v_max, power, linear_zero_pos);
        if (axis == ImGuiAxis_Y)
            grab_t = 1.0f - grab_t;
        const float grab_pos = ImLerp(slider_usable_pos_min, slider_usable_pos_max, grab_t);
        if (axis == ImGuiAxis_X)
            *out_grab_bb = ImRect(grab_pos - grab_sz * 0.5f, bb.Min.y + grab_padding, grab_pos + grab_sz * 0.5f, bb.Max.y - grab_padding);
        else
            *out_grab_bb = ImRect(bb.Min.x + grab_padding, grab_pos - grab_sz * 0.5f, bb.Max.x - grab_padding, grab_pos + grab_sz * 0.5f);
    }

    return value_changed;
}